

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_arg.hpp
# Opt level: O0

String * __thiscall Args::MultiArg::value_abi_cxx11_(MultiArg *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  const_reference local_8;
  
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(unaff_retaddr);
  if (bVar1) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(unaff_retaddr);
    if (bVar1) {
      local_8 = (const_reference)details::DummyString<void>::c_string_abi_cxx11_;
    }
    else {
      local_8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front(in_RDI);
    }
  }
  else {
    local_8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front(in_RDI);
  }
  return local_8;
}

Assistant:

inline const String &
MultiArg::value() const
{
	if( !m_values.empty() )
		return m_values.front();
	else if( !m_defaultValues.empty() )
		return m_defaultValues.front();
	else
		return details::DummyString<>::c_string;
}